

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O3

void av1_encode_sb_row(AV1_COMP *cpi,ThreadData_conflict *td,int tile_row,int tile_col,int mi_row)

{
  ulong *puVar1;
  _Bool _Var2;
  MODE MVar3;
  _Bool _Var4;
  uint8_t uVar5;
  BLOCK_SIZE BVar6;
  PARTITION_SEARCH_TYPE PVar7;
  INTERNAL_COST_UPDATE_TYPE IVar8;
  SequenceHeader *pSVar9;
  SIMPLE_MOTION_DATA_TREE *sms_root;
  MB_MODE_INFO *pMVar10;
  TokenList *pTVar11;
  RD_STATS best_rdc;
  RD_STATS best_rdc_00;
  RD_STATS best_rdc_01;
  RD_STATS best_rdc_02;
  MACROBLOCK *pMVar12;
  MACROBLOCKD *pMVar13;
  ENTROPY_CONTEXT (*paEVar14) [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  BLOCK_SIZE BVar18;
  BLOCK_SIZE BVar19;
  BLOCK_SIZE BVar20;
  int iVar21;
  CB_COEFF_BUFFER *pCVar22;
  EncSegmentationInfo *pEVar23;
  int *piVar24;
  PC_TREE *pPVar25;
  SB_FIRST_PASS_STATS *pSVar26;
  uint uVar27;
  SOURCE_SAD SVar28;
  long lVar29;
  ulong uVar30;
  byte bVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  TileInfo *tile_info;
  TileDataEnc *tile_data;
  BLOCK_SIZE BVar35;
  uint uVar36;
  FRAME_CONTEXT *pFVar37;
  int iVar38;
  uint uVar39;
  int iVar40;
  byte bVar41;
  uint uVar42;
  int iVar43;
  MB_MODE_INFO **mib;
  bool bVar44;
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  TokenExtra *tok;
  int local_148;
  undefined4 local_144;
  ulong local_140;
  ulong local_138;
  long local_130;
  long local_128;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  ulong local_110;
  ulong local_108;
  CommonModeInfoParams *local_100;
  ulong local_f8;
  AV1_COMMON *local_f0;
  int local_e4;
  uint local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int dummy_rate;
  SuperBlockEnc *local_c8;
  TokenExtra *(*local_c0) [64];
  AV1EncRowMultiThreadSync *local_b8;
  RD_STATS local_b0;
  int64_t dummy_dist;
  int64_t iStack_80;
  long local_78;
  int64_t iStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  int *local_48;
  SB_FIRST_PASS_STATS *local_40;
  long local_38;
  long lVar46;
  
  local_c0 = (cpi->token_info).tile_tok;
  tile_data = cpi->tile_data + ((cpi->common).tiles.cols * tile_row + tile_col);
  tok = (TokenExtra *)0x0;
  if (((cpi->token_info).tile_tok[0][0] != (TokenExtra *)0x0) &&
     ((cpi->token_info).tplist[0][0] != (TokenList *)0x0)) {
    pSVar9 = (cpi->common).seq_params;
    iVar38 = mi_row - (tile_data->tile_info).mi_row_start;
    bVar41 = (byte)pSVar9->mib_size_log2;
    bVar31 = bVar41 - 2;
    uVar42 = ~(-1 << (bVar31 & 0x1f));
    tok = local_c0[tile_row][tile_col] +
          (uint)((((1 << (bVar41 + 2 & 0x1f)) << (bVar41 + 2 & 0x1f)) <<
                 (pSVar9->monochrome == '\0')) *
                 ((int)((iVar38 + 2 >> 2) + uVar42) >> (bVar31 & 0x1f)) *
                ((int)(uVar42 + (((tile_data->tile_info).mi_col_end -
                                 (tile_data->tile_info).mi_col_start) + 2 >> 2)) >> (bVar31 & 0x1f))
                );
    (cpi->token_info).tplist[tile_row][tile_col][iVar38 >> (bVar41 & 0x1f)].start = tok;
  }
  local_f0 = &cpi->common;
  _Var2 = (cpi->mt_info).row_mt_enabled;
  local_120 = tile_row;
  local_11c = tile_col;
  local_118 = av1_get_sb_cols_in_tile(local_f0,&tile_data->tile_info);
  pSVar9 = (cpi->common).seq_params;
  local_114 = mi_row - (tile_data->tile_info).mi_row_start >> ((byte)pSVar9->mib_size_log2 & 0x1f);
  local_110 = (ulong)pSVar9->sb_size;
  local_108 = (ulong)(uint)pSVar9->mib_size;
  local_d8 = (cpi->sf).rt_sf.use_nonrd_pick_mode;
  paEVar14 = (td->mb).e_mbd.left_entropy_context;
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x10) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x11) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x12) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x13) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x14) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x15) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x16) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x17) = '\0';
  paEVar14 = (td->mb).e_mbd.left_entropy_context;
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x18) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x19) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x1a) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x1b) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x1c) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x1d) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x1e) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0x1f) = '\0';
  pMVar13 = &(td->mb).e_mbd;
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 2) + 0) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 2) + 1) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 2) + 2) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 2) + 3) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 2) + 4) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 2) + 5) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 2) + 6) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 2) + 7) = '\0';
  paEVar14 = (td->mb).e_mbd.left_entropy_context;
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 8) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 9) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 10) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0xb) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0xc) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0xd) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0xe) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 2) + 0xf) = '\0';
  paEVar14 = (td->mb).e_mbd.left_entropy_context;
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x10) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x11) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x12) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x13) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x14) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x15) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x16) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x17) = '\0';
  paEVar14 = (td->mb).e_mbd.left_entropy_context;
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x18) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x19) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x1a) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x1b) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x1c) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x1d) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x1e) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0x1f) = '\0';
  pMVar13 = &(td->mb).e_mbd;
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 1) + 0) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 1) + 1) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 1) + 2) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 1) + 3) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 1) + 4) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 1) + 5) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 1) + 6) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 1) + 7) = '\0';
  paEVar14 = (td->mb).e_mbd.left_entropy_context;
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 8) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 9) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 10) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0xb) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0xc) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0xd) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0xe) = '\0';
  *(ENTROPY_CONTEXT *)((long)(paEVar14 + 1) + 0xf) = '\0';
  pMVar13 = &(td->mb).e_mbd;
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x10) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x11) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x12) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x13) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x14) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x15) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x16) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x17) = '\0';
  pMVar13 = &(td->mb).e_mbd;
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x18) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x19) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x1a) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x1b) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x1c) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x1d) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x1e) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0x1f) = '\0';
  pMVar12 = &td->mb;
  *(ENTROPY_CONTEXT *)((long)((pMVar12->e_mbd).left_entropy_context + 0) + 0) = '\0';
  *(ENTROPY_CONTEXT *)((long)((pMVar12->e_mbd).left_entropy_context + 0) + 1) = '\0';
  *(ENTROPY_CONTEXT *)((long)((pMVar12->e_mbd).left_entropy_context + 0) + 2) = '\0';
  *(ENTROPY_CONTEXT *)((long)((pMVar12->e_mbd).left_entropy_context + 0) + 3) = '\0';
  *(ENTROPY_CONTEXT *)((long)((pMVar12->e_mbd).left_entropy_context + 0) + 4) = '\0';
  *(ENTROPY_CONTEXT *)((long)((pMVar12->e_mbd).left_entropy_context + 0) + 5) = '\0';
  *(ENTROPY_CONTEXT *)((long)((pMVar12->e_mbd).left_entropy_context + 0) + 6) = '\0';
  *(ENTROPY_CONTEXT *)((long)((pMVar12->e_mbd).left_entropy_context + 0) + 7) = '\0';
  pMVar13 = &(td->mb).e_mbd;
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 8) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 9) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 10) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0xb) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0xc) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0xd) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0xe) = '\0';
  *(ENTROPY_CONTEXT *)((long)(pMVar13->left_entropy_context + 0) + 0xf) = '\0';
  (td->mb).e_mbd.left_partition_context[0] = '\0';
  (td->mb).e_mbd.left_partition_context[1] = '\0';
  (td->mb).e_mbd.left_partition_context[2] = '\0';
  (td->mb).e_mbd.left_partition_context[3] = '\0';
  (td->mb).e_mbd.left_partition_context[4] = '\0';
  (td->mb).e_mbd.left_partition_context[5] = '\0';
  (td->mb).e_mbd.left_partition_context[6] = '\0';
  (td->mb).e_mbd.left_partition_context[7] = '\0';
  pMVar12 = &td->mb;
  (pMVar12->e_mbd).left_partition_context[8] = '\0';
  (pMVar12->e_mbd).left_partition_context[9] = '\0';
  (pMVar12->e_mbd).left_partition_context[10] = '\0';
  (pMVar12->e_mbd).left_partition_context[0xb] = '\0';
  (pMVar12->e_mbd).left_partition_context[0xc] = '\0';
  (pMVar12->e_mbd).left_partition_context[0xd] = '\0';
  (pMVar12->e_mbd).left_partition_context[0xe] = '\0';
  (pMVar12->e_mbd).left_partition_context[0xf] = '\0';
  pMVar12 = &td->mb;
  (pMVar12->e_mbd).left_partition_context[0x10] = '\0';
  (pMVar12->e_mbd).left_partition_context[0x11] = '\0';
  (pMVar12->e_mbd).left_partition_context[0x12] = '\0';
  (pMVar12->e_mbd).left_partition_context[0x13] = '\0';
  (pMVar12->e_mbd).left_partition_context[0x14] = '\0';
  (pMVar12->e_mbd).left_partition_context[0x15] = '\0';
  (pMVar12->e_mbd).left_partition_context[0x16] = '\0';
  (pMVar12->e_mbd).left_partition_context[0x17] = '\0';
  pMVar12 = &td->mb;
  (pMVar12->e_mbd).left_partition_context[0x18] = '\0';
  (pMVar12->e_mbd).left_partition_context[0x19] = '\0';
  (pMVar12->e_mbd).left_partition_context[0x1a] = '\0';
  (pMVar12->e_mbd).left_partition_context[0x1b] = '\0';
  (pMVar12->e_mbd).left_partition_context[0x1c] = '\0';
  (pMVar12->e_mbd).left_partition_context[0x1d] = '\0';
  (pMVar12->e_mbd).left_partition_context[0x1e] = '\0';
  (pMVar12->e_mbd).left_partition_context[0x1f] = '\0';
  builtin_memcpy((td->mb).e_mbd.left_txfm_context_buffer,"@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@",0x20);
  if ((tile_data->tile_info).mi_row_start == mi_row || (_Var2 & 1U) != 0) {
    if ((cpi->common).delta_q_info.delta_q_present_flag != 0) {
      (td->mb).e_mbd.current_base_qindex = (cpi->common).quant_params.base_qindex;
    }
    if ((cpi->common).delta_q_info.delta_lf_present_flag != 0) {
      av1_reset_loop_filter_delta
                (&(td->mb).e_mbd,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
    }
  }
  auVar17 = _DAT_004d09d0;
  auVar16 = _DAT_004d09c0;
  auVar15 = _DAT_004d09b0;
  local_b8 = &tile_data->row_mt_sync;
  piVar24 = (td->mb).thresh_freq_fact[0] + 3;
  lVar29 = 0;
  do {
    lVar32 = 0;
    auVar45 = auVar16;
    auVar47 = auVar15;
    do {
      auVar48 = auVar45 ^ auVar17;
      if (auVar48._4_4_ == -0x80000000 && auVar48._0_4_ < -0x7fffff57) {
        piVar24[lVar32 + -3] = 0x20;
        piVar24[lVar32 + -2] = 0x20;
      }
      auVar48 = auVar47 ^ auVar17;
      if (auVar48._4_4_ == -0x80000000 && auVar48._0_4_ < -0x7fffff57) {
        piVar24[lVar32 + -1] = 0x20;
        piVar24[lVar32] = 0x20;
      }
      lVar32 = lVar32 + 4;
      lVar46 = auVar45._8_8_;
      auVar45._0_8_ = auVar45._0_8_ + 4;
      auVar45._8_8_ = lVar46 + 4;
      lVar46 = auVar47._8_8_;
      auVar47._0_8_ = auVar47._0_8_ + 4;
      auVar47._8_8_ = lVar46 + 4;
    } while (lVar32 != 0xac);
    lVar29 = lVar29 + 1;
    piVar24 = piVar24 + 0xa9;
  } while (lVar29 != 0x16);
  iVar38 = (tile_data->tile_info).mi_col_start;
  if (iVar38 < (tile_data->tile_info).mi_col_end) {
    local_48 = &(td->mb).sb_me_partition;
    local_100 = &(cpi->common).mi_params;
    local_c8 = &(td->mb).sb_enc;
    local_e4 = mi_row + 0x20;
    local_dc = (int)local_108 + mi_row;
    uVar42 = -iVar38;
    local_130 = 0;
    do {
      uVar30 = (ulong)uVar42;
      MVar3 = (cpi->oxcf).mode;
      if (MVar3 == '\x01') {
        iVar21 = 0;
        if (((cpi->sf).inter_sf.coeff_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET) &&
           ((cpi->sf).inter_sf.mode_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET)) {
          lVar29 = 0x60b00;
          IVar8 = (cpi->sf).intra_sf.dv_cost_upd_level;
          goto joined_r0x001aa53b;
        }
      }
      else {
        iVar21 = 0;
        if ((MVar3 == '\x02') &&
           ((cpi->sf).inter_sf.coeff_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET)) {
          lVar29 = 0x60ba8;
          IVar8 = (cpi->sf).inter_sf.mode_cost_upd_level;
joined_r0x001aa53b:
          iVar21 = 0;
          if (IVar8 < INTERNAL_COST_UPD_SBROW_SET) {
            iVar21 = -(uint)(*(uint *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) +
                                      lVar29) < 2);
          }
        }
      }
      (*(cpi->mt_info).enc_row_mt.sync_read_ptr)(local_b8,local_114,iVar21 + (int)local_130);
      if ((_Var2 & 1U) == 0) {
LAB_001aa5d1:
        local_144 = 0;
      }
      else {
        pthread_mutex_lock((pthread_mutex_t *)(cpi->mt_info).enc_row_mt.mutex_);
        _Var4 = (cpi->mt_info).enc_row_mt.row_mt_exit;
        iVar21 = pthread_mutex_unlock((pthread_mutex_t *)(cpi->mt_info).enc_row_mt.mutex_);
        if (_Var4 != false) break;
        if (tile_data->allow_update_cdf == '\0') goto LAB_001aa5d1;
        local_144 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar21 >> 8),1);
        if ((tile_data->tile_info).mi_row_start != mi_row) {
          if ((tile_data->tile_info).mi_col_start == iVar38) {
            memcpy((td->mb).e_mbd.tile_ctx,(td->mb).row_ctx,0x52fc);
          }
          else {
            pFVar37 = (td->mb).row_ctx + local_130;
            if ((tile_data->tile_info).mi_col_end <= (int)local_108 + iVar38) {
              pFVar37 = pFVar37 + -1;
            }
            av1_avg_cdf_symbols((td->mb).e_mbd.tile_ctx,pFVar37,3,1);
          }
        }
      }
      av1_set_cost_upd_freq(cpi,td,&tile_data->tile_info,mi_row,iVar38);
      (td->mb).color_sensitivity_sb[0] = '\0';
      (td->mb).color_sensitivity_sb[1] = '\0';
      (td->mb).color_sensitivity_sb_g[0] = '\0';
      (td->mb).color_sensitivity_sb_g[1] = '\0';
      (td->mb).color_sensitivity_sb_alt[0] = '\0';
      (td->mb).color_sensitivity_sb_alt[1] = '\0';
      (td->mb).color_sensitivity[0] = '\0';
      (td->mb).color_sensitivity[1] = '\0';
      (td->mb).content_state_sb.source_sad_nonrd = kMedSad;
      (td->mb).content_state_sb.source_sad_rd = kMedSad;
      (td->mb).content_state_sb.lighting_change = 0;
      (td->mb).content_state_sb.low_sumdiff = 0;
      (td->mb).force_zeromv_skip_for_sb = 0;
      ((int_mv *)(local_48 + 4))->as_int = 0;
      local_48[0] = 0;
      local_48[1] = 0;
      *(undefined8 *)(local_48 + 2) = 0;
      (td->mb).sb_force_fixed_part = 1;
      (td->mb).color_palette_thresh = 0x40;
      (td->mb).force_color_check_block_level = 0;
      (td->mb).nonrd_prune_ref_frame_search = (cpi->sf).rt_sf.nonrd_prune_ref_frame_search;
      if ((cpi->oxcf).mode == '\x02') {
        (td->mb).intra_sb_rdmult_modifier = 0x80;
      }
      (td->mb).e_mbd.cur_frame_force_integer_mv =
           (uint)(cpi->common).features.cur_frame_force_integer_mv;
      (td->mb).source_variance = 0xffffffff;
      pCVar22 = av1_get_cb_coeff_buffer(cpi,mi_row,iVar38);
      (td->mb).cb_coef_buff = pCVar22;
      if ((cpi->common).seg.enabled == '\0') {
        uVar42 = 0;
      }
      else {
        pEVar23 = &cpi->enc_seg;
        if ((cpi->common).seg.update_map == '\0') {
          pEVar23 = (EncSegmentationInfo *)&(cpi->common).last_frame_seg_map;
        }
        if (pEVar23->map == (uint8_t *)0x0) {
          uVar34 = 0;
        }
        else {
          uVar27 = (cpi->common).mi_params.mi_rows - mi_row;
          if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [local_110] <= (int)uVar27) {
            uVar27 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [local_110];
          }
          if ((int)uVar27 < 1) {
            uVar34 = 8;
          }
          else {
            iVar21 = (cpi->common).mi_params.mi_cols;
            bVar41 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [local_110];
            uVar36 = iVar21 - iVar38;
            if ((int)(uint)bVar41 <= iVar21 - iVar38) {
              uVar36 = (uint)bVar41;
            }
            uVar39 = (uint)bVar41;
            if ((int)(iVar21 + uVar42) < (int)(uint)bVar41) {
              uVar39 = iVar21 + uVar42;
            }
            iVar40 = mi_row * iVar21 + iVar38;
            bVar31 = 8;
            bVar41 = 8;
            uVar42 = 0;
            do {
              uVar34 = (ulong)uVar39;
              iVar43 = iVar40;
              if (0 < (int)uVar36) {
                do {
                  bVar41 = pEVar23->map[iVar43];
                  if (bVar31 < bVar41) {
                    bVar41 = bVar31;
                  }
                  iVar43 = iVar43 + 1;
                  uVar34 = uVar34 - 1;
                  bVar31 = bVar41;
                } while (uVar34 != 0);
              }
              uVar42 = uVar42 + 1;
              iVar40 = iVar40 + iVar21;
            } while (uVar42 != uVar27);
            uVar34 = (ulong)bVar41;
          }
        }
        uVar42 = (cpi->common).seg.feature_mask[uVar34] >> 6 & 1;
      }
      (td->mb).is_sb_gradient_cached[0] = false;
      (td->mb).is_sb_gradient_cached[1] = false;
      local_140 = uVar30;
      if ((((((local_f0->current_frame).frame_type & 0xfd) == 0) &&
           ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0)) &&
          ((cpi->sf).part_sf.partition_search_type == '\0')) &&
         (((cpi->sf).intra_sf.intra_pruning_with_hog != 0 ||
          ((cpi->sf).intra_sf.chroma_intra_pruning_with_hog != 0)))) {
        local_138 = CONCAT44(local_138._4_4_,uVar42);
        uVar5 = ((cpi->common).seq_params)->monochrome;
        BVar6 = (BLOCK_SIZE)local_110;
        av1_setup_src_planes
                  (&td->mb,cpi->source,mi_row,iVar38,(uVar5 == '\0') + 1 + (uint)(uVar5 == '\0'),
                   BVar6);
        if ((cpi->sf).intra_sf.intra_pruning_with_hog != 0) {
          compute_gradient_info_sb(&td->mb,BVar6,'\0');
          (td->mb).is_sb_gradient_cached[0] = true;
        }
        uVar42 = (uint)local_138;
        if ((uVar5 == '\0') && ((cpi->sf).intra_sf.chroma_intra_pruning_with_hog != 0)) {
          compute_gradient_info_sb(&td->mb,(BLOCK_SIZE)local_110,'\x01');
          (td->mb).is_sb_gradient_cached[1] = true;
          uVar42 = (uint)local_138;
        }
      }
      if (((cpi->oxcf).mode == '\x02') &&
         ((((cpi->sf).part_sf.partition_search_type == '\0' ||
           ((0.0 < (double)(cpi->oxcf).speed * -0.25 + 1.0 &&
            (((cpi->sf).rt_sf.use_nonrd_pick_mode == 0 ||
             ((cpi->sf).rt_sf.hybrid_intra_pickmode != 0)))))) &&
          ((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [local_110] *
           (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [local_110] != 0)))) {
        uVar30 = (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                               [local_110] *
                        (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                              [local_110]);
        piVar24 = &((td->mb).src_var_info_of_4x4_sub_blocks)->var;
        do {
          *piVar24 = -1;
          ((Block4x4VarInfo *)(piVar24 + -2))->log_var = -1.0;
          piVar24 = piVar24 + 4;
          uVar30 = uVar30 - 1;
        } while (uVar30 != 0);
      }
      if (((uVar42 == 0) && ((local_f0->current_frame).frame_type != '\0')) &&
         ((cpi->ppi->use_svc == 0 ||
          ((cpi->svc).layer_context[(cpi->svc).temporal_layer_id].is_key_frame == 0)))) {
        if ((cpi->sf).rt_sf.source_metrics_sb_nonrd == 0) {
          if ((0 < (cpi->sf).rt_sf.var_part_based_on_qidx) &&
             ((cpi->common).height * (cpi->common).width < 0x18c01)) {
            if ((cpi->rc).frame_source_sad != 0) goto LAB_001ab00c;
            (td->mb).content_state_sb.source_sad_rd = kZeroSad;
          }
        }
        else if (((cpi->sf).rt_sf.check_scene_detection == 0) || ((cpi->rc).frame_source_sad != 0))
        {
          if (((cpi->svc).number_spatial_layers + -1 <= (cpi->svc).spatial_layer_id) &&
             (cpi->src_sad_blk_64x64 != (uint64_t *)0x0)) {
            pSVar9 = (cpi->common).seq_params;
            BVar6 = pSVar9->sb_size;
            iVar40 = pSVar9->mib_size >> (BVar6 == BLOCK_128X128);
            iVar21 = ((cpi->common).mi_params.mi_cols + iVar40 + -1) / iVar40;
            if ((mi_row / iVar40 < (iVar40 + -1 + (cpi->common).mi_params.mi_rows) / iVar40 + -1) &&
               (iVar38 / iVar40 < iVar21 + -1)) {
              puVar1 = cpi->src_sad_blk_64x64 + ((mi_row / iVar40) * iVar21 + iVar38 / iVar40);
              if (BVar6 == BLOCK_64X64) {
                uVar30 = *puVar1;
              }
              else {
                if (BVar6 != BLOCK_128X128) goto LAB_001ab00c;
                uVar30 = (puVar1 + iVar21)[1] + puVar1[1] + puVar1[iVar21] + *puVar1;
              }
              if (uVar30 != 0xffffffffffffffff) {
                SVar28 = kZeroSad;
                if (uVar30 == 0) {
LAB_001abb66:
                  (td->mb).content_state_sb.source_sad_nonrd = SVar28;
                  goto LAB_001aa913;
                }
                if (8 < (cpi->oxcf).speed) {
                  iVar21 = (cpi->common).width;
                  iVar40 = (cpi->common).height;
                  if (iVar21 < iVar40) {
                    iVar40 = iVar21;
                  }
                  if (iVar40 < 0x168) {
                    uVar34 = uVar30 + 2 >> 2;
                    if (BVar6 != BLOCK_128X128) {
                      uVar34 = uVar30;
                    }
                    bVar44 = (cpi->sf).rt_sf.increase_source_sad_thresh == 0;
                    uVar30 = 30000;
                    if (bVar44) {
                      uVar30 = 15000;
                    }
                    uVar33 = 80000;
                    if (bVar44) {
                      uVar33 = 40000;
                    }
                    SVar28 = kMedSad;
                    if (uVar34 < uVar33 && uVar30 < uVar34) goto LAB_001abb66;
                  }
                }
              }
            }
          }
LAB_001ab00c:
          av1_source_content_sb(cpi,&td->mb,tile_data,mi_row,iVar38);
        }
        else {
          (td->mb).content_state_sb.source_sad_nonrd = kZeroSad;
        }
      }
LAB_001aa913:
      mib = (cpi->common).mi_params.mi_grid_base +
            ((cpi->common).mi_params.mi_stride * mi_row + iVar38);
      pSVar9 = (cpi->common).seq_params;
      BVar6 = pSVar9->sb_size;
      local_128 = CONCAT71(local_128._1_7_,BVar6);
      if (local_d8 == 0) {
        local_138 = CONCAT44(local_138._4_4_,uVar42);
        bVar44 = pSVar9->monochrome == '\0';
        local_148 = bVar44 + 1 + (uint)bVar44;
        sms_root = td->sms_root;
        init_encode_rd_sb(cpi,td,tile_data,sms_root,&local_b0,mi_row,iVar38,1);
        PVar7 = (cpi->sf).part_sf.partition_search_type;
        if (PVar7 == '\x02') {
          av1_set_offsets(cpi,&tile_data->tile_info,&td->mb,mi_row,iVar38,BVar6);
          av1_choose_var_based_partitioning(cpi,&tile_data->tile_info,td,&td->mb,mi_row,iVar38);
          pPVar25 = av1_alloc_pc_tree_node(BVar6);
          td->pc_root = pPVar25;
          if (pPVar25 == (PC_TREE *)0x0) {
            aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PC_TREE");
            pPVar25 = td->pc_root;
          }
          av1_rd_use_partition
                    (cpi,td,tile_data,mib,&tok,mi_row,iVar38,BVar6,&dummy_rate,&dummy_dist,1,pPVar25
                    );
          av1_free_pc_tree_recursive
                    (td->pc_root,local_148,0,0,(cpi->sf).part_sf.partition_search_type);
          td->pc_root = (PC_TREE *)0x0;
LAB_001aaf09:
          iVar21 = (int)local_140;
        }
        else {
          iVar21 = (uint)local_138;
          if ((uint)local_138 != 0 || PVar7 == '\x01') {
            av1_set_offsets(cpi,&tile_data->tile_info,&td->mb,mi_row,iVar38,BVar6);
            BVar20 = (BLOCK_SIZE)local_128;
            if (iVar21 == 0) {
              BVar20 = (cpi->sf).part_sf.fixed_partition_size;
            }
            av1_set_fixed_partitioning(cpi,&tile_data->tile_info,mib,mi_row,iVar38,BVar20);
            pPVar25 = av1_alloc_pc_tree_node(BVar6);
            td->pc_root = pPVar25;
            if (pPVar25 == (PC_TREE *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate PC_TREE");
              pPVar25 = td->pc_root;
            }
            av1_rd_use_partition
                      (cpi,td,tile_data,mib,&tok,mi_row,iVar38,BVar6,&dummy_rate,&dummy_dist,1,
                       pPVar25);
            av1_free_pc_tree_recursive
                      (td->pc_root,local_148,0,0,(cpi->sf).part_sf.partition_search_type);
            td->pc_root = (PC_TREE *)0x0;
            goto LAB_001aaf09;
          }
          av1_get_tpl_stats_sb(cpi,BVar6,mi_row,iVar38,local_c8);
          av1_reset_simple_motion_tree_partition(sms_root,BVar6);
          BVar20 = (cpi->sf).part_sf.default_max_partition_size;
          BVar19 = (cpi->oxcf).part_cfg.max_partition_size;
          BVar18 = BLOCK_4X4;
          iVar21 = (int)local_140;
          if (BVar19 < 0x20) {
            BVar35 = BLOCK_8X8;
            if (BVar19 == BLOCK_32X16) goto LAB_001ab063;
            if (BVar19 == BLOCK_4X16) {
              BVar35 = BLOCK_16X16;
              goto LAB_001ab063;
            }
          }
          else {
            if (BVar19 == 0x20) {
              BVar35 = BLOCK_32X32;
            }
            else if (BVar19 == 0x40) {
              BVar35 = BLOCK_64X64;
            }
            else {
              BVar18 = BLOCK_4X4;
              if (BVar19 != 0x80) goto LAB_001ab06a;
              BVar35 = BLOCK_128X128;
            }
LAB_001ab063:
            BVar18 = BVar20;
            if (BVar35 <= BVar20) {
              BVar18 = BLOCK_4X4;
              if (BVar19 < 0x20) {
                if (BVar19 == BLOCK_32X16) {
                  BVar18 = BLOCK_8X8;
                }
                else if (BVar19 == BLOCK_4X16) {
                  BVar18 = BLOCK_16X16;
                }
              }
              else if (BVar19 == 0x20) {
                BVar18 = BLOCK_32X32;
              }
              else if (BVar19 == 0x40) {
                BVar18 = BLOCK_64X64;
              }
              else if (BVar19 == 0x80) {
                BVar18 = BLOCK_128X128;
              }
            }
          }
LAB_001ab06a:
          BVar20 = (cpi->sf).part_sf.default_min_partition_size;
          BVar19 = (cpi->oxcf).part_cfg.min_partition_size;
          BVar35 = BLOCK_4X4;
          if (BVar19 < 0x20) {
            if (BVar19 == BLOCK_32X16) {
              BVar35 = BLOCK_8X8;
            }
            else if (BVar19 == BLOCK_4X16) {
              BVar35 = BLOCK_16X16;
            }
          }
          else if (BVar19 == 0x20) {
            BVar35 = BLOCK_32X32;
          }
          else if (BVar19 == 0x40) {
            BVar35 = BLOCK_64X64;
          }
          else if (BVar19 == 0x80) {
            BVar35 = BLOCK_128X128;
          }
          if (BVar20 <= BVar35) {
            BVar20 = BLOCK_4X4;
            if (BVar19 < 0x20) {
              if (BVar19 == BLOCK_32X16) {
                BVar20 = BLOCK_8X8;
              }
              else if (BVar19 == BLOCK_4X16) {
                BVar20 = BLOCK_16X16;
              }
            }
            else if (BVar19 == 0x20) {
              BVar20 = BLOCK_32X32;
            }
            else if (BVar19 == 0x40) {
              BVar20 = BLOCK_64X64;
            }
            else if (BVar19 == 0x80) {
              BVar20 = BLOCK_128X128;
            }
          }
          BVar19 = (BLOCK_SIZE)*(undefined4 *)&((cpi->common).seq_params)->sb_size;
          if (BVar19 <= BVar18) {
            BVar18 = BVar19;
          }
          if (BVar20 < BVar19) {
            BVar19 = BVar20;
          }
          (td->mb).sb_enc.max_partition_size = BVar18;
          (td->mb).sb_enc.min_partition_size = BVar19;
          if ((((((cpi->common).current_frame.frame_type & 0xfd) != 0) &&
               (cpi->use_screen_content_tools == 0)) && ((BLOCK_SIZE)local_128 == '\x0f')) &&
             ((((cpi->sf).part_sf.auto_max_partition_based_on_simple_motion != '\0' &&
               (local_e4 <= (cpi->common).mi_params.mi_rows)) &&
              ((iVar38 + 0x20 <= (cpi->common).mi_params.mi_cols &&
               (((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] & 0xfe) != 4)))))) {
            local_68._0_1_ = '\0';
            local_68._1_7_ = 0;
            uStack_60 = 0;
            local_78 = 0;
            iStack_70 = 0;
            dummy_dist = 0;
            iStack_80 = 0;
            local_58 = 0;
            av1_get_max_min_partition_features(cpi,&td->mb,mi_row,iVar38,(float *)&dummy_dist);
            BVar19 = av1_predict_max_partition(cpi,&td->mb,(float *)&dummy_dist);
            BVar20 = (td->mb).sb_enc.max_partition_size;
            if (BVar19 < BVar20) {
              BVar20 = av1_predict_max_partition(cpi,&td->mb,(float *)&dummy_dist);
            }
            BVar19 = local_c8->min_partition_size;
            if (BVar19 < BVar20) {
              BVar20 = av1_predict_max_partition(cpi,&td->mb,(float *)&dummy_dist);
              BVar19 = (td->mb).sb_enc.max_partition_size;
              if (BVar20 < BVar19) {
                BVar19 = av1_predict_max_partition(cpi,&td->mb,(float *)&dummy_dist);
              }
            }
            (td->mb).sb_enc.max_partition_size = BVar19;
          }
          uVar42 = (cpi->oxcf).unit_test_cfg.sb_multipass_unit_test;
          if ((((cpi->oxcf).sb_qp_sweep != 0) &&
              ((((cpi->oxcf).pass != AOM_RC_ONE_PASS || (cpi->ppi->lap_enabled != 0)) ||
               (((cpi->oxcf).mode != '\x01' || ((cpi->oxcf).gf_cfg.lag_in_frames != 0)))))) &&
             ((cpi->common).delta_q_info.delta_q_present_flag != 0)) {
            local_e0 = uVar42;
            pSVar26 = (SB_FIRST_PASS_STATS *)aom_malloc(0x4b70);
            (td->mb).sb_stats_cache = pSVar26;
            if (pSVar26 == (SB_FIRST_PASS_STATS *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate td->mb.sb_stats_cache");
              pSVar26 = (td->mb).sb_stats_cache;
            }
            av1_backup_sb_state(pSVar26,cpi,td,tile_data,mi_row,iVar38);
            local_40 = (td->mb).sb_stats_cache;
            local_f8 = (ulong)(uint)(td->mb).rdmult_delta_qindex;
            bVar44 = (cpi->common).current_frame.frame_type == '\0';
            uVar42 = (uint)!bVar44 * 8 - 0x14;
            local_d0 = (uint)bVar44 * 8 + 0xc;
            local_d4 = (cpi->common).delta_q_info.delta_q_res;
            lVar29 = 0x7fffffffffffffff;
            do {
              local_138 = (ulong)uVar42;
              local_128 = lVar29;
              sb_qp_sweep_init_quantizers
                        (cpi,td,tile_data,sms_root,(RD_STATS *)&dummy_dist,mi_row,iVar38,uVar42);
              lVar29 = (long)((mi_row / (int)(uint)
                                                  "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                                  [(cpi->common).mi_params.mi_alloc_bsize]) *
                              (cpi->common).mi_params.mi_alloc_stride +
                             iVar38 / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                                 [(cpi->common).mi_params.mi_alloc_bsize]);
              local_38 = lVar29 * 0xb0;
              local_148 = (cpi->common).mi_params.mi_alloc[lVar29].current_qindex;
              av1_reset_mbmi(local_100,BVar6,mi_row,iVar38);
              av1_restore_sb_state(local_40,cpi,td,tile_data,mi_row,iVar38);
              *(int *)((long)((cpi->common).mi_params.mi_alloc)->mv + local_38 + -4) = local_148;
              pPVar25 = av1_alloc_pc_tree_node(BVar6);
              td->pc_root = pPVar25;
              if (pPVar25 == (PC_TREE *)0x0) {
                aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                   "Failed to allocate PC_TREE");
                pPVar25 = td->pc_root;
              }
              best_rdc.dist = iStack_80;
              best_rdc.rate = (undefined4)dummy_dist;
              best_rdc.zero_rate = dummy_dist._4_4_;
              best_rdc.rdcost = local_78;
              best_rdc.sse = iStack_70;
              best_rdc._32_4_ = (int)local_68;
              best_rdc._36_4_ = SUB84(local_68,4);
              av1_rd_pick_partition
                        (cpi,td,tile_data,&tok,mi_row,iVar38,BVar6,(RD_STATS *)&dummy_dist,best_rdc,
                         pPVar25,sms_root,(int64_t *)0x0,'\x01',(RD_RECT_PART_WIN_INFO *)0x0);
              iVar21 = (td->mb).rdmult_delta_qindex;
              uVar42 = (uint)local_138;
              if (local_78 < local_128) {
LAB_001ab43b:
                local_f8 = (ulong)(uVar42 + iVar21);
                lVar29 = local_78;
              }
              else {
                uVar27 = -uVar42;
                if (0 < (int)uVar42) {
                  uVar27 = uVar42;
                }
                uVar39 = (int)local_f8 - iVar21;
                uVar36 = -uVar39;
                if (0 < (int)uVar39) {
                  uVar36 = uVar39;
                }
                lVar29 = local_128;
                if ((local_128 == local_78) && (uVar27 < uVar36)) goto LAB_001ab43b;
              }
              uVar42 = uVar42 + local_d4;
            } while ((int)uVar42 <= local_d0);
            sb_qp_sweep_init_quantizers
                      (cpi,td,tile_data,sms_root,&local_b0,mi_row,iVar38,(int)local_f8 - iVar21);
            iVar40 = (mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                          [(cpi->common).mi_params.mi_alloc_bsize]) *
                     (cpi->common).mi_params.mi_alloc_stride +
                     iVar38 / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                         [(cpi->common).mi_params.mi_alloc_bsize];
            iVar21 = (cpi->common).mi_params.mi_alloc[iVar40].current_qindex;
            av1_reset_mbmi(local_100,BVar6,mi_row,iVar38);
            av1_restore_sb_state((td->mb).sb_stats_cache,cpi,td,tile_data,mi_row,iVar38);
            (cpi->common).mi_params.mi_alloc[iVar40].current_qindex = iVar21;
            aom_free((td->mb).sb_stats_cache);
            (td->mb).sb_stats_cache = (SB_FIRST_PASS_STATS *)0x0;
            iVar21 = (int)local_140;
            uVar42 = local_e0;
          }
          if (uVar42 == 0) {
            pPVar25 = av1_alloc_pc_tree_node(BVar6);
            td->pc_root = pPVar25;
            if (pPVar25 == (PC_TREE *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate PC_TREE");
              pPVar25 = td->pc_root;
            }
            best_rdc_02.dist = local_b0.dist;
            best_rdc_02.rate = local_b0.rate;
            best_rdc_02.zero_rate = local_b0.zero_rate;
            best_rdc_02.rdcost = local_b0.rdcost;
            best_rdc_02.sse = local_b0.sse;
            best_rdc_02._32_4_ = local_b0._32_4_;
            best_rdc_02._36_4_ = local_b0._36_4_;
            av1_rd_pick_partition
                      (cpi,td,tile_data,&tok,mi_row,iVar38,BVar6,&local_b0,best_rdc_02,pPVar25,
                       sms_root,(int64_t *)0x0,'\0',(RD_RECT_PART_WIN_INFO *)0x0);
          }
          else {
            pSVar26 = (SB_FIRST_PASS_STATS *)aom_malloc(0x4b70);
            (td->mb).sb_fp_stats = pSVar26;
            if (pSVar26 == (SB_FIRST_PASS_STATS *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate td->mb.sb_fp_stats");
              pSVar26 = (td->mb).sb_fp_stats;
            }
            av1_backup_sb_state(pSVar26,cpi,td,tile_data,mi_row,iVar38);
            pPVar25 = av1_alloc_pc_tree_node(BVar6);
            td->pc_root = pPVar25;
            if (pPVar25 == (PC_TREE *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate PC_TREE");
              pPVar25 = td->pc_root;
            }
            best_rdc_00.dist = local_b0.dist;
            best_rdc_00.rate = local_b0.rate;
            best_rdc_00.zero_rate = local_b0.zero_rate;
            best_rdc_00.rdcost = local_b0.rdcost;
            best_rdc_00.sse = local_b0.sse;
            best_rdc_00._32_4_ = local_b0._32_4_;
            best_rdc_00._36_4_ = local_b0._36_4_;
            av1_rd_pick_partition
                      (cpi,td,tile_data,&tok,mi_row,iVar38,BVar6,&local_b0,best_rdc_00,pPVar25,
                       sms_root,(int64_t *)0x0,'\x01',(RD_RECT_PART_WIN_INFO *)0x0);
            init_encode_rd_sb(cpi,td,tile_data,sms_root,&local_b0,mi_row,iVar38,0);
            av1_reset_mbmi(local_100,BVar6,mi_row,iVar38);
            av1_reset_simple_motion_tree_partition(sms_root,BVar6);
            av1_restore_sb_state((td->mb).sb_fp_stats,cpi,td,tile_data,mi_row,iVar38);
            pPVar25 = av1_alloc_pc_tree_node(BVar6);
            td->pc_root = pPVar25;
            if (pPVar25 == (PC_TREE *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate PC_TREE");
              pPVar25 = td->pc_root;
            }
            best_rdc_01.dist = local_b0.dist;
            best_rdc_01.rate = local_b0.rate;
            best_rdc_01.zero_rate = local_b0.zero_rate;
            best_rdc_01.rdcost = local_b0.rdcost;
            best_rdc_01.sse = local_b0.sse;
            best_rdc_01._32_4_ = local_b0._32_4_;
            best_rdc_01._36_4_ = local_b0._36_4_;
            av1_rd_pick_partition
                      (cpi,td,tile_data,&tok,mi_row,iVar38,BVar6,&local_b0,best_rdc_01,pPVar25,
                       sms_root,(int64_t *)0x0,'\x02',(RD_RECT_PART_WIN_INFO *)0x0);
            aom_free((td->mb).sb_fp_stats);
            (td->mb).sb_fp_stats = (SB_FIRST_PASS_STATS *)0x0;
          }
          (td->mb).sb_enc.tpl_data_count = 0;
        }
        if ((((cpi->sf).inter_sf.inter_mode_rd_model_estimation == 1) &&
            ((cpi->common).tiles.cols == 1)) && ((cpi->common).tiles.rows == 1)) {
          av1_inter_mode_data_fit(tile_data,(td->mb).rdmult);
        }
      }
      else {
        pPVar25 = td->pc_root;
        PVar7 = (cpi->sf).part_sf.partition_search_type;
        if ((PVar7 == '\x01' || (char)uVar42 != '\0') ||
           ((((cpi->sf).rt_sf.use_fast_fixed_part != 0 && ((td->mb).sb_force_fixed_part == 1)) &&
            ((((local_f0->current_frame).frame_type & 0xfd) != 0 &&
             ((cpi->ppi->use_svc == 0 ||
              ((cpi->svc).layer_context[(cpi->svc).temporal_layer_id].is_key_frame == 0)))))))) {
          av1_set_offsets(cpi,&tile_data->tile_info,&td->mb,mi_row,iVar38,BVar6);
          BVar20 = (cpi->sf).part_sf.fixed_partition_size;
          if (((cpi->sf).rt_sf.use_fast_fixed_part != 0) &&
             ((td->mb).content_state_sb.source_sad_nonrd < kLowSad)) {
            BVar20 = ((cpi->common).seq_params)->sb_size;
          }
          if ((((cpi->sf).rt_sf.skip_encoding_non_reference_slide_change != 0) &&
              ((cpi->rc).high_source_sad != 0)) && ((cpi->ppi->rtc_ref).non_reference_frame != 0)) {
            BVar20 = ((cpi->common).seq_params)->sb_size;
            (td->mb).force_zeromv_skip_for_sb = 1;
          }
          if (uVar42 != 0) {
            BVar20 = BVar6;
          }
          if ((td->mb).content_state_sb.source_sad_nonrd != kZeroSad) {
            (td->mb).force_color_check_block_level = 1;
          }
          av1_set_fixed_partitioning(cpi,&tile_data->tile_info,mib,mi_row,iVar38,BVar20);
        }
        else if (PVar7 == '\x02') {
          av1_set_offsets(cpi,&tile_data->tile_info,&td->mb,mi_row,iVar38,BVar6);
          av1_choose_var_based_partitioning(cpi,&tile_data->tile_info,td,&td->mb,mi_row,iVar38);
        }
        (td->mb).cb_offset[0] = 0;
        (td->mb).cb_offset[1] = 0;
        if ((cpi->sf).rt_sf.skip_cdef_sb != 0) {
          iVar21 = ((BLOCK_SIZE)local_128 == '\x0f') + 1;
          iVar40 = 0;
          do {
            iVar43 = 0;
            do {
              pMVar10 = mib[((cpi->common).mi_params.mi_stride * iVar40 + iVar43) * 0x10];
              if (pMVar10 != (MB_MODE_INFO *)0x0) {
                *(ushort *)&pMVar10->field_0xa7 = *(ushort *)&pMVar10->field_0xa7 & 0x87ff | 0x800;
              }
              iVar43 = iVar43 + 1;
            } while (iVar21 != iVar43);
            iVar40 = iVar40 + 1;
          } while (iVar40 != iVar21);
        }
        av1_nonrd_use_partition(cpi,td,tile_data,mib,&tok,mi_row,iVar38,BVar6,pPVar25);
        iVar21 = (int)local_140;
      }
      if (((char)local_144 != '\0') && (local_dc < (tile_data->tile_info).mi_row_end)) {
        if (local_118 == 1) {
          pFVar37 = (td->mb).row_ctx;
        }
        else {
          if (local_130 == 0) goto LAB_001ab987;
          pFVar37 = (td->mb).row_ctx + local_130 + -1;
        }
        memcpy(pFVar37,(td->mb).e_mbd.tile_ctx,0x52fc);
      }
LAB_001ab987:
      lVar29 = local_130;
      (*(cpi->mt_info).enc_row_mt.sync_write_ptr)(local_b8,local_114,(int)local_130,local_118);
      iVar38 = iVar38 + (int)local_108;
      local_130 = lVar29 + 1;
      uVar42 = iVar21 - (int)local_108;
    } while (iVar38 < (tile_data->tile_info).mi_col_end);
  }
  if (((*local_c0)[0] != (TokenExtra *)0x0) && ((cpi->token_info).tplist[0][0] != (TokenList *)0x0))
  {
    pTVar11 = (cpi->token_info).tplist[local_120][local_11c];
    iVar38 = mi_row - (tile_data->tile_info).mi_row_start >>
             ((byte)((cpi->common).seq_params)->mib_size_log2 & 0x1f);
    pTVar11[iVar38].count = (int)tok - *(int *)&pTVar11[iVar38].start;
  }
  return;
}

Assistant:

void av1_encode_sb_row(AV1_COMP *cpi, ThreadData *td, int tile_row,
                       int tile_col, int mi_row) {
  AV1_COMMON *const cm = &cpi->common;
  const int tile_cols = cm->tiles.cols;
  TileDataEnc *this_tile = &cpi->tile_data[tile_row * tile_cols + tile_col];
  const TileInfo *const tile_info = &this_tile->tile_info;
  TokenExtra *tok = NULL;

  get_token_start(cpi, tile_info, tile_row, tile_col, mi_row, &tok);

  encode_sb_row(cpi, td, this_tile, mi_row, &tok);

  populate_token_count(cpi, tile_info, tile_row, tile_col, mi_row, tok);
}